

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int append_node_to_array(trie_node ***ary,uint *len,trie_node *n)

{
  long lVar1;
  trie_node **pptVar2;
  long in_FS_OFFSET;
  trie_node **new;
  trie_node *n_local;
  uint *len_local;
  trie_node ***ary_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pptVar2 = (trie_node **)lrtr_realloc(*ary,(ulong)*len << 6);
  if (pptVar2 == (trie_node **)0x0) {
    ary_local._4_4_ = -1;
  }
  else {
    *ary = pptVar2;
    (*ary)[*len - 1] = n;
    ary_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ary_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int append_node_to_array(struct trie_node ***ary, unsigned int *len, struct trie_node *n)
{
	struct trie_node **new;

	new = lrtr_realloc(*ary, *len * sizeof(*n));
	if (!new)
		return -1;

	*ary = new;
	(*ary)[*len - 1] = n;
	return 0;
}